

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator02buggy.cpp
# Opt level: O1

double factorial(double d)

{
  int iVar1;
  runtime_error *this;
  int iVar2;
  double dVar3;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (((double)(int)d == d) && (!NAN((double)(int)d) && !NAN(d))) {
    iVar1 = (int)d;
    if (iVar1 == 0) {
      dVar3 = 1.0;
    }
    else {
      if (2 < iVar1) {
        iVar2 = iVar1 + 1;
        do {
          iVar1 = iVar1 * (iVar2 + -2);
          iVar2 = iVar2 + -1;
        } while (3 < iVar2);
      }
      dVar3 = (double)iVar1;
    }
    return dVar3;
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"\'!\' could be used only on integers","");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double factorial(double d)
{
	auto i = static_cast<int32_t>(d);
	if (i != d)
		error("'!' could be used only on integers");
	if (i == 0)
		return 1.0; // factorial of 0 is 1
	for (auto j = (i - 1); j > 1; --j)
		i *= j;
	return static_cast<double>(i);
}